

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_factor.c
# Opt level: O0

int iterFactorConv(mpt_convertable *val,mpt_type_t type,void *ptr)

{
  mpt_iteratorFactor *d;
  void *ptr_local;
  mpt_type_t type_local;
  mpt_convertable *val_local;
  
  if (type == 0) {
    if (ptr == (void *)0x0) {
      val_local._4_4_ = 0x86;
    }
    else {
      *(uint8_t **)ptr = iterFactorConv::fmt;
      val_local._4_4_ = 100;
    }
  }
  else if (type == 0x86) {
    if (ptr != (void *)0x0) {
      *(mpt_convertable **)ptr = val + 1;
    }
    val_local._4_4_ = 100;
  }
  else {
    val_local._4_4_ = -3;
  }
  return val_local._4_4_;
}

Assistant:

static int iterFactorConv(MPT_INTERFACE(convertable) *val, MPT_TYPE(type) type, void *ptr)
{
	MPT_STRUCT(iteratorFactor) *d = MPT_baseaddr(iteratorFactor, val, _mt);
	if (!type) {
		static const uint8_t fmt[] = { MPT_ENUM(TypeIteratorPtr), 0 };
		if (ptr) {
			*((const uint8_t **) ptr) = fmt;
			return 'd';
		}
		return MPT_ENUM(TypeIteratorPtr);
	}
	if (type == MPT_ENUM(TypeIteratorPtr)) {
		if (ptr) *((const void **) ptr) = (void *) (&d->_it);
		return 'd';
	}
	return MPT_ERROR(BadType);
}